

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O0

Json __thiscall json11::anon_unknown_21::JsonParser::fail(JsonParser *this,string *msg)

{
  Json *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Json JVar1;
  Json local_30;
  string *msg_local;
  JsonParser *this_local;
  
  msg_local = msg;
  this_local = this;
  Json::Json(&local_30);
  fail<json11::Json>(this,msg,in_RDX);
  Json::~Json(&local_30);
  JVar1.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar1.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Json)JVar1.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Json fail(string &&msg) {
        return fail(move(msg), Json());
    }